

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

string * testing::internal::JoinAsTuple(string *__return_storage_ptr__,Strings *fields)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_28;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  Strings *fields_local;
  string *result;
  
  local_18 = fields;
  fields_local = (Strings *)__return_storage_ptr__;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(fields);
  if (sVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)((long)&i + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  }
  else if (sVar1 == 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,0);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  }
  else {
    i._6_1_ = 0;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_18,0);
    std::operator+(__return_storage_ptr__,"(",pvVar2);
    for (local_28 = 1;
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_18), local_28 < sVar1; local_28 = local_28 + 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_18,local_28);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar2);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ std::string JoinAsTuple(const Strings& fields) {
  switch (fields.size()) {
    case 0:
      return "";
    case 1:
      return fields[0];
    default:
      std::string result = "(" + fields[0];
      for (size_t i = 1; i < fields.size(); i++) {
        result += ", ";
        result += fields[i];
      }
      result += ")";
      return result;
  }
}